

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

shared_ptr<const_unsigned_long> __thiscall
pstore::database::getro<unsigned_long,void>(database *this,extent<unsigned_long> *ex)

{
  value_type vVar1;
  address size;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_unsigned_long> sVar2;
  address local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  extent<unsigned_long> *ex_local;
  database *this_local;
  
  local_20._M_pi = in_RDX;
  ex_local = ex;
  this_local = this;
  local_28 = typed_address<unsigned_long>::to_address((typed_address<unsigned_long> *)in_RDX);
  vVar1 = address::absolute(&stack0xffffffffffffffd8);
  if ((vVar1 & 7) != 0) {
    raise<pstore::error_code>(bad_alignment);
  }
  size = typed_address<unsigned_long>::to_address((typed_address<unsigned_long> *)local_20._M_pi);
  getro((database *)&stack0xffffffffffffffc8,(address)ex,size.a_);
  std::static_pointer_cast<unsigned_long_const,void_const>((shared_ptr<const_void> *)this);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)&stack0xffffffffffffffc8);
  sVar2.super___shared_ptr<const_unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_unsigned_long>)
         sVar2.super___shared_ptr<const_unsigned_long,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T const> database::getro (extent<T> const & ex) const {
        if (ex.addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        // Note that ex.size specifies the size in bytes of the data to be loaded, not the
        // number of elements of type T. For this reason we call the plain address version of
        // getro().
        return std::static_pointer_cast<T const> (this->getro (ex.addr.to_address (), ex.size));
    }